

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poisson.cpp
# Opt level: O0

void LoadDensityMap(char *FileName)

{
  ostream *poVar1;
  uchar *puVar2;
  ulong uVar3;
  int local_28;
  int local_24;
  int x;
  int y;
  uchar *Data;
  int H;
  int W;
  char *FileName_local;
  
  _H = FileName;
  poVar1 = std::operator<<((ostream *)&std::cout,"Loading density map ");
  poVar1 = std::operator<<(poVar1,_H);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  puVar2 = LoadBMP(_H,(int *)((long)&Data + 4),(int *)&Data);
  poVar1 = std::operator<<((ostream *)&std::cout,"Loaded ( ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Data._4_4_);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)Data);
  poVar1 = std::operator<<(poVar1," ) ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((Data._4_4_ == 0x200) && ((int)Data == 0x200)) {
    uVar3 = SUB168(ZEXT816(0x40000) * ZEXT816(4),0);
    if (SUB168(ZEXT816(0x40000) * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    g_DensityMap = (float *)operator_new__(uVar3);
    for (local_24 = 0; local_24 != (int)Data; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 != Data._4_4_; local_28 = local_28 + 1) {
        g_DensityMap[local_28 + local_24 * Data._4_4_] =
             (float)puVar2[(local_28 + local_24 * Data._4_4_) * 3] / 255.0;
      }
    }
    if (puVar2 != (uchar *)0x0) {
      operator_delete__(puVar2);
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: density map should be ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x200);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x200);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(0xff);
}

Assistant:

void LoadDensityMap(const char* FileName) {
  std::cout << "Loading density map " << FileName << std::endl;

  int W, H;
  unsigned char* Data = LoadBMP(FileName, &W, &H);

  std::cout << "Loaded ( " << W << " x " << H << " ) " << std::endl;

  if (W != kImageSize || H != kImageSize) {
    std::cout << "ERROR: density map should be " << kImageSize << " x " << kImageSize << std::endl;

    exit(255);
  }

  g_DensityMap = new float[W * H];

  for (int y = 0; y != H; y++) {
    for (int x = 0; x != W; x++) {
      g_DensityMap[x + y * W] = float(Data[3 * (x + y * W)]) / 255.0f;
    }
  }

  delete[] (Data);
}